

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O3

void __thiscall sc_core::sc_module::end_module(sc_module *this)

{
  sc_simcontext *psVar1;
  
  if (this->m_end_module_called == false) {
    sc_simcontext::hierarchy_pop((this->super_sc_object).m_simc);
    psVar1 = (this->super_sc_object).m_simc;
    (psVar1->m_curr_proc_info).process_handle = (sc_process_b *)0x0;
    (psVar1->m_curr_proc_info).kind = SC_NO_PROC_;
    psVar1->m_current_writer = (sc_process_b *)0x0;
    sc_process_b::m_last_created_process_p = 0;
    sc_sensitive::reset(&this->sensitive);
    sc_sensitive_pos::reset(&this->sensitive_pos);
    sc_sensitive_neg::reset(&this->sensitive_neg);
    this->m_end_module_called = true;
    this->m_module_name_p = (sc_module_name *)0x0;
  }
  return;
}

Assistant:

void
sc_module::end_module()
{
    if( ! m_end_module_called ) {
	/* TBD: Can check here to alert the user that end_module
                was not called for a previous module. */
	(void)sc_get_curr_simcontext()->hierarchy_pop();
	sc_get_curr_simcontext()->reset_curr_proc(); 
	sensitive.reset();
	sensitive_pos.reset();
	sensitive_neg.reset();
	m_end_module_called = true;
	m_module_name_p = 0; // make sure we are not called in ~sc_module().
    }
}